

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExtensionalityClauseContainer.cpp
# Opt level: O3

void __thiscall
Saturation::ExtensionalityClauseContainer::print(ExtensionalityClauseContainer *this,ostream *out)

{
  Entry *pEVar1;
  uint uVar2;
  char cVar3;
  Entry *pEVar4;
  ostream *poVar5;
  List<Saturation::ExtensionalityClause> *pLVar6;
  Entry *pEVar7;
  ExtensionalityClause c;
  string local_98;
  string local_78;
  Entry *local_58;
  Entry *local_50;
  Clause *local_48;
  Literal *pLStack_40;
  TermList local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,"#####################",0x15);
  cVar3 = (char)out;
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  pEVar4 = (this->_clausesBySort)._entries;
  pEVar7 = (this->_clausesBySort)._afterLast;
  if (pEVar4 != pEVar7) {
    uVar2 = (this->_clausesBySort)._timestamp;
    local_58 = pEVar7;
    do {
      while (pEVar1 = pEVar4 + 1,
            ((pEVar4->field_0)._infoData & 1U) != 0 ||
            (uint)(pEVar4->field_0)._infoData >> 2 != uVar2) {
        pEVar4 = pEVar1;
        if (pEVar1 == pEVar7) goto LAB_0066c144;
      }
      pLVar6 = pEVar4->_val;
      local_50 = pEVar1;
      while (pLVar6 != (List<Saturation::ExtensionalityClause> *)0x0) {
        local_38._content = (pLVar6->_head).sort._content;
        local_48 = (pLVar6->_head).clause;
        pLStack_40 = (pLVar6->_head).literal;
        pLVar6 = pLVar6->_tail;
        Kernel::Clause::toString_abi_cxx11_(&local_78,local_48);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (out,local_78._M_dataplus._M_p,local_78._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        Kernel::Literal::toString_abi_cxx11_(&local_98,pLStack_40);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar5,local_98._M_dataplus._M_p,local_98._M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        poVar5 = (ostream *)std::ostream::flush();
        poVar5 = Kernel::operator<<(poVar5,&local_38);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
        std::ostream::put((char)poVar5);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
        }
      }
      pEVar4 = local_50;
      pEVar7 = local_58;
    } while (local_50 != local_58);
  }
LAB_0066c144:
  std::__ostream_insert<char,std::char_traits<char>>(out,"#####################",0x15);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void ExtensionalityClauseContainer::print (std::ostream& out) {
  out << "#####################" << endl;

  ClausesBySort::Iterator cbs(_clausesBySort);

  while(cbs.hasNext()){
    ExtensionalityClauseList* l = cbs.next();
    ExtensionalityClauseList::Iterator it(l);
    while(it.hasNext()) {
      ExtensionalityClause c = it.next();
      out << c.clause->toString() << endl
          << c.literal->toString() << endl
          << c.sort << endl;
    }
  }
  
  out << "#####################" << endl;
}